

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O3

_Bool pickoneauth(auth *pick,unsigned_long mask)

{
  _Bool _Var1;
  ulong uVar2;
  
  uVar2 = mask & pick->avail & pick->want;
  if ((uVar2 & 4) == 0) {
    if ((uVar2 & 0x40) == 0) {
      if ((uVar2 & 2) == 0) {
        if ((uVar2 & 8) == 0) {
          if ((uVar2 & 1) == 0) {
            if (-1 < (char)uVar2) {
              pick->picked = 0x40000000;
              _Var1 = false;
              goto LAB_00135094;
            }
            pick->picked = 0x80;
          }
          else {
            pick->picked = 1;
          }
        }
        else {
          pick->picked = 8;
        }
      }
      else {
        pick->picked = 2;
      }
    }
    else {
      pick->picked = 0x40;
    }
  }
  else {
    pick->picked = 4;
  }
  _Var1 = true;
LAB_00135094:
  pick->avail = 0;
  return _Var1;
}

Assistant:

static bool pickoneauth(struct auth *pick, unsigned long mask)
{
  bool picked;
  /* only deal with authentication we want */
  unsigned long avail = pick->avail & pick->want & mask;
  picked = TRUE;

  /* The order of these checks is highly relevant, as this will be the order
     of preference in case of the existence of multiple accepted types. */
  if(avail & CURLAUTH_NEGOTIATE)
    pick->picked = CURLAUTH_NEGOTIATE;
#ifndef CURL_DISABLE_BEARER_AUTH
  else if(avail & CURLAUTH_BEARER)
    pick->picked = CURLAUTH_BEARER;
#endif
#ifndef CURL_DISABLE_DIGEST_AUTH
  else if(avail & CURLAUTH_DIGEST)
    pick->picked = CURLAUTH_DIGEST;
#endif
  else if(avail & CURLAUTH_NTLM)
    pick->picked = CURLAUTH_NTLM;
#ifndef CURL_DISABLE_BASIC_AUTH
  else if(avail & CURLAUTH_BASIC)
    pick->picked = CURLAUTH_BASIC;
#endif
#ifndef CURL_DISABLE_AWS
  else if(avail & CURLAUTH_AWS_SIGV4)
    pick->picked = CURLAUTH_AWS_SIGV4;
#endif
  else {
    pick->picked = CURLAUTH_PICKNONE; /* we select to use nothing */
    picked = FALSE;
  }
  pick->avail = CURLAUTH_NONE; /* clear it here */

  return picked;
}